

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::CheckSecondFramebufferContent
          (FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLubyte (*paGVar3) [4];
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  bool bVar7;
  GLubyte framebuffer_values [3] [4];
  undefined8 local_30;
  undefined4 local_28;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo_2nd);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e01);
  puVar6 = &local_30;
  local_28 = 0;
  local_30 = 0;
  uVar5 = 0;
  (**(code **)(lVar4 + 0x1220))(0,0,4,3,0x1903,0x1401,puVar6);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e0a);
  paGVar3 = CheckSecondFramebufferContent::reference_values;
  bVar7 = false;
  do {
    lVar4 = 0;
    do {
      if ((*paGVar3)[lVar4] != *(GLubyte *)((long)puVar6 + lVar4)) {
        return bVar7;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    bVar7 = 1 < uVar5;
    uVar5 = uVar5 + 1;
    paGVar3 = paGVar3 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  } while (uVar5 != 3);
  return true;
}

Assistant:

bool FunctionalTest::CheckSecondFramebufferContent()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_2nd);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	glw::GLubyte framebuffer_values[3][4] = {
		{ 0 } /* , ... */
	};

	static const glw::GLubyte reference_values[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 255, 0 }, { 0, 0, 0, 0 } };

	gl.readPixels(0, 0, 4, 3, GL_RED, GL_UNSIGNED_BYTE, framebuffer_values);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	for (glw::GLuint j = 0; j < 3; ++j)
	{
		for (glw::GLuint i = 0; i < 4; ++i)
		{
			if (reference_values[j][i] != framebuffer_values[j][i])
			{
				return false;
			}
		}
	}

	return true;
}